

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall raft_functional_common::TestMgr::save_config(TestMgr *this,cluster_config *config)

{
  ptr<buffer> buf;
  undefined1 local_30 [16];
  buffer *local_20;
  
  nuraft::cluster_config::serialize((cluster_config *)&stack0xffffffffffffffe0);
  nuraft::cluster_config::deserialize((cluster_config *)local_30,local_20);
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->savedConfig).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void save_config(const cluster_config& config) {
        ptr<buffer> buf = config.serialize();
        savedConfig = cluster_config::deserialize(*buf);
    }